

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O1

int run_test_fs_unlink_readonly(void)

{
  int iVar1;
  __uid_t _Var2;
  int extraout_EAX;
  undefined8 uVar3;
  uv_loop_t *puVar4;
  void *pvVar5;
  char *pcVar6;
  uv_loop_t *puVar7;
  char *pcVar8;
  uv_loop_t *puVar9;
  char *pcVar10;
  char *unaff_R14;
  char *pcVar11;
  char *pcVar12;
  uv_buf_t uVar13;
  uv_fs_t req;
  undefined1 auStack_760 [88];
  long lStack_708;
  long lStack_700;
  code *pcStack_5a8;
  code *pcStack_5a0;
  undefined8 uStack_598;
  char acStack_588 [88];
  char *pcStack_530;
  uv_loop_t *puStack_3d0;
  code *pcStack_3c8;
  code *pcStack_3c0;
  code *pcStack_3b8;
  uv_loop_t *puStack_3b0;
  code *pcStack_3a8;
  char acStack_3a0 [88];
  uv_loop_t *puStack_348;
  char *pcStack_1e8;
  code *pcStack_1e0;
  undefined8 local_1d8;
  char local_1c8 [88];
  char *local_170;
  
  pcVar6 = "test_file";
  pcStack_1e0 = (code *)0x155421;
  unlink("test_file");
  pcStack_1e0 = (code *)0x155426;
  loop = (uv_loop_t *)uv_default_loop();
  pcStack_1e0 = (code *)0x15544a;
  iVar1 = uv_fs_open(0,local_1c8,"test_file",0x42,0x180,0);
  pcVar10 = local_170;
  if (iVar1 < 0) {
    pcStack_1e0 = (code *)0x1555e7;
    run_test_fs_unlink_readonly_cold_1();
LAB_001555e7:
    pcStack_1e0 = (code *)0x1555ec;
    run_test_fs_unlink_readonly_cold_2();
LAB_001555ec:
    pcStack_1e0 = (code *)0x1555f1;
    run_test_fs_unlink_readonly_cold_3();
LAB_001555f1:
    pcStack_1e0 = (code *)0x1555f6;
    run_test_fs_unlink_readonly_cold_4();
LAB_001555f6:
    pcStack_1e0 = (code *)0x1555fb;
    run_test_fs_unlink_readonly_cold_5();
LAB_001555fb:
    pcStack_1e0 = (code *)0x155600;
    run_test_fs_unlink_readonly_cold_6();
LAB_00155600:
    pcStack_1e0 = (code *)0x155605;
    run_test_fs_unlink_readonly_cold_7();
LAB_00155605:
    pcStack_1e0 = (code *)0x15560a;
    run_test_fs_unlink_readonly_cold_8();
  }
  else {
    pcVar6 = local_170;
    if ((long)local_170 < 0) goto LAB_001555e7;
    unaff_R14 = local_1c8;
    pcStack_1e0 = (code *)0x15546d;
    uv_fs_req_cleanup(unaff_R14);
    pcStack_1e0 = (code *)0x15547e;
    iov = (uv_buf_t)uv_buf_init(test_buf,0xd);
    local_1d8 = 0;
    pcStack_1e0 = (code *)0x1554b4;
    iVar1 = uv_fs_write(0,unaff_R14,(ulong)pcVar10 & 0xffffffff,&iov,1,0xffffffffffffffff);
    pcVar6 = pcVar10;
    if (iVar1 != 0xd) goto LAB_001555ec;
    if (local_170 != (char *)0xd) goto LAB_001555f1;
    unaff_R14 = local_1c8;
    pcStack_1e0 = (code *)0x1554d6;
    uv_fs_req_cleanup(unaff_R14);
    pcStack_1e0 = (code *)0x1554e9;
    uv_fs_close(loop,unaff_R14,(ulong)pcVar10 & 0xffffffff,0);
    pcStack_1e0 = (code *)0x155502;
    iVar1 = uv_fs_chmod(0,unaff_R14,"test_file",0x100,0);
    if (iVar1 != 0) goto LAB_001555f6;
    if (local_170 != (char *)0x0) goto LAB_001555fb;
    pcVar6 = local_1c8;
    pcStack_1e0 = (code *)0x155523;
    uv_fs_req_cleanup(pcVar6);
    unaff_R14 = "test_file";
    pcStack_1e0 = (code *)0x155537;
    check_permission("test_file",0x100);
    pcStack_1e0 = (code *)0x155546;
    iVar1 = uv_fs_unlink(0,pcVar6,"test_file",0);
    if (iVar1 != 0) goto LAB_00155600;
    if (local_170 != (char *)0x0) goto LAB_00155605;
    pcStack_1e0 = (code *)0x155567;
    uv_fs_req_cleanup(local_1c8);
    pcStack_1e0 = (code *)0x155575;
    uv_run(loop,0);
    unaff_R14 = "test_file";
    pcStack_1e0 = (code *)0x155591;
    uv_fs_chmod(0,local_1c8,"test_file",0x180,0);
    pcStack_1e0 = (code *)0x155599;
    uv_fs_req_cleanup(local_1c8);
    pcStack_1e0 = (code *)0x1555a1;
    unlink("test_file");
    pcStack_1e0 = (code *)0x1555a6;
    pcVar6 = (char *)uv_default_loop();
    pcStack_1e0 = (code *)0x1555ba;
    uv_walk(pcVar6,close_walk_cb,0);
    pcStack_1e0 = (code *)0x1555c4;
    uv_run(pcVar6,0);
    pcStack_1e0 = (code *)0x1555c9;
    uVar3 = uv_default_loop();
    pcStack_1e0 = (code *)0x1555d1;
    iVar1 = uv_loop_close(uVar3);
    if (iVar1 == 0) {
      return 0;
    }
  }
  pcStack_1e0 = run_test_fs_chown;
  run_test_fs_unlink_readonly_cold_9();
  pcVar11 = acStack_3a0;
  pcVar12 = acStack_3a0;
  pcVar8 = acStack_3a0;
  pcVar10 = acStack_3a0;
  puVar7 = (uv_loop_t *)0x184385;
  pcStack_3a8 = (code *)0x155628;
  pcStack_1e8 = pcVar6;
  pcStack_1e0 = (code *)unaff_R14;
  unlink("test_file");
  pcStack_3a8 = (code *)0x155634;
  unlink("test_file_link");
  pcStack_3a8 = (code *)0x155639;
  loop = (uv_loop_t *)uv_default_loop();
  puVar4 = (uv_loop_t *)0x0;
  pcStack_3a8 = (code *)0x15565b;
  iVar1 = uv_fs_open(0,acStack_3a0,"test_file",0x42,0x180,0);
  puVar9 = puStack_348;
  if (iVar1 < 0) {
    pcStack_3a8 = (code *)0x15592c;
    run_test_fs_chown_cold_1();
LAB_0015592c:
    pcStack_3a8 = (code *)0x155931;
    run_test_fs_chown_cold_2();
LAB_00155931:
    pcStack_3a8 = (code *)0x155936;
    run_test_fs_chown_cold_3();
LAB_00155936:
    pcVar11 = unaff_R14;
    pcStack_3a8 = (code *)0x15593b;
    run_test_fs_chown_cold_4();
LAB_0015593b:
    pcStack_3a8 = (code *)0x155940;
    run_test_fs_chown_cold_5();
LAB_00155940:
    pcVar12 = pcVar11;
    pcStack_3a8 = (code *)0x155945;
    run_test_fs_chown_cold_6();
LAB_00155945:
    pcStack_3a8 = (code *)0x15594a;
    run_test_fs_chown_cold_7();
LAB_0015594a:
    pcStack_3a8 = (code *)0x15594f;
    run_test_fs_chown_cold_8();
LAB_0015594f:
    pcStack_3a8 = (code *)0x155954;
    run_test_fs_chown_cold_9();
LAB_00155954:
    pcStack_3a8 = (code *)0x155959;
    run_test_fs_chown_cold_10();
LAB_00155959:
    pcStack_3a8 = (code *)0x15595e;
    run_test_fs_chown_cold_11();
LAB_0015595e:
    pcStack_3a8 = (code *)0x155963;
    run_test_fs_chown_cold_12();
LAB_00155963:
    pcStack_3a8 = (code *)0x155968;
    run_test_fs_chown_cold_13();
LAB_00155968:
    pcVar8 = pcVar12;
    pcStack_3a8 = (code *)0x15596d;
    run_test_fs_chown_cold_14();
LAB_0015596d:
    pcStack_3a8 = (code *)0x155972;
    run_test_fs_chown_cold_15();
LAB_00155972:
    pcVar10 = pcVar8;
    pcStack_3a8 = (code *)0x155977;
    run_test_fs_chown_cold_16();
LAB_00155977:
    pcStack_3a8 = (code *)0x15597c;
    run_test_fs_chown_cold_17();
LAB_0015597c:
    pcStack_3a8 = (code *)0x155981;
    run_test_fs_chown_cold_18();
LAB_00155981:
    pcStack_3a8 = (code *)0x155986;
    run_test_fs_chown_cold_19();
LAB_00155986:
    pcStack_3a8 = (code *)0x15598b;
    run_test_fs_chown_cold_20();
  }
  else {
    puVar7 = puStack_348;
    if ((long)puStack_348 < 0) goto LAB_0015592c;
    pcStack_3a8 = (code *)0x15567c;
    uv_fs_req_cleanup();
    puVar4 = (uv_loop_t *)0x0;
    pcStack_3a8 = (code *)0x15569b;
    iVar1 = uv_fs_chown(0,acStack_3a0,"test_file",0xffffffff,0xffffffff,0);
    puVar7 = puVar9;
    unaff_R14 = acStack_3a0;
    if (iVar1 != 0) goto LAB_00155931;
    unaff_R14 = acStack_3a0;
    if (puStack_348 != (uv_loop_t *)0x0) goto LAB_00155936;
    pcStack_3a8 = (code *)0x1556ba;
    uv_fs_req_cleanup();
    puVar4 = (uv_loop_t *)0x0;
    pcStack_3a8 = (code *)0x1556d4;
    iVar1 = uv_fs_fchown(0,acStack_3a0,(ulong)puVar9 & 0xffffffff,0xffffffff,0xffffffff,0);
    if (iVar1 != 0) goto LAB_0015593b;
    pcVar11 = acStack_3a0;
    if (puStack_348 != (uv_loop_t *)0x0) goto LAB_00155940;
    pcStack_3a8 = (code *)0x1556f3;
    uv_fs_req_cleanup(acStack_3a0);
    pcStack_3a8 = (code *)0x15571b;
    puVar4 = loop;
    iVar1 = uv_fs_chown(loop,acStack_3a0,"test_file",0xffffffff,0xffffffff,chown_cb);
    if (iVar1 != 0) goto LAB_00155945;
    pcStack_3a8 = (code *)0x155731;
    puVar4 = loop;
    uv_run(loop,0);
    pcVar12 = acStack_3a0;
    if (chown_cb_count != 1) goto LAB_0015594a;
    chown_cb_count = 0;
    pcStack_3a8 = (code *)0x15576a;
    puVar4 = loop;
    iVar1 = uv_fs_chown(loop,acStack_3a0,"test_file",0,0,chown_root_cb);
    pcVar12 = acStack_3a0;
    if (iVar1 != 0) goto LAB_0015594f;
    pcStack_3a8 = (code *)0x155780;
    puVar4 = loop;
    uv_run(loop,0);
    pcVar12 = acStack_3a0;
    if (chown_cb_count != 1) goto LAB_00155954;
    pcStack_3a8 = (code *)0x1557b0;
    puVar4 = loop;
    iVar1 = uv_fs_fchown(loop,acStack_3a0,(ulong)puVar9 & 0xffffffff,0xffffffff,0xffffffff,fchown_cb
                        );
    pcVar12 = acStack_3a0;
    if (iVar1 != 0) goto LAB_00155959;
    pcStack_3a8 = (code *)0x1557c6;
    puVar4 = loop;
    uv_run(loop,0);
    pcVar12 = acStack_3a0;
    if (fchown_cb_count != 1) goto LAB_0015595e;
    puVar4 = (uv_loop_t *)0x0;
    pcStack_3a8 = (code *)0x1557ee;
    iVar1 = uv_fs_link(0,acStack_3a0,"test_file","test_file_link",0);
    pcVar12 = acStack_3a0;
    if (iVar1 != 0) goto LAB_00155963;
    pcVar12 = acStack_3a0;
    if (puStack_348 != (uv_loop_t *)0x0) goto LAB_00155968;
    pcStack_3a8 = (code *)0x15580d;
    uv_fs_req_cleanup();
    puVar4 = (uv_loop_t *)0x0;
    pcStack_3a8 = (code *)0x15582c;
    iVar1 = uv_fs_lchown(0,acStack_3a0,"test_file_link",0xffffffff,0xffffffff,0);
    if (iVar1 != 0) goto LAB_0015596d;
    pcVar8 = acStack_3a0;
    if (puStack_348 != (uv_loop_t *)0x0) goto LAB_00155972;
    pcStack_3a8 = (code *)0x15584b;
    uv_fs_req_cleanup(acStack_3a0);
    pcStack_3a8 = (code *)0x155873;
    puVar4 = loop;
    iVar1 = uv_fs_lchown(loop,acStack_3a0,"test_file_link",0xffffffff,0xffffffff,lchown_cb);
    if (iVar1 != 0) goto LAB_00155977;
    pcStack_3a8 = (code *)0x155889;
    puVar4 = loop;
    uv_run(loop,0);
    pcVar10 = acStack_3a0;
    if (lchown_cb_count != 1) goto LAB_0015597c;
    puVar4 = (uv_loop_t *)0x0;
    pcStack_3a8 = (code *)0x1558a4;
    iVar1 = uv_fs_close(0,acStack_3a0,(ulong)puVar9 & 0xffffffff,0);
    pcVar10 = acStack_3a0;
    if (iVar1 != 0) goto LAB_00155981;
    pcVar10 = acStack_3a0;
    if (puStack_348 != (uv_loop_t *)0x0) goto LAB_00155986;
    pcStack_3a8 = (code *)0x1558c0;
    uv_fs_req_cleanup(acStack_3a0);
    pcStack_3a8 = (code *)0x1558ce;
    uv_run(loop,0);
    pcStack_3a8 = (code *)0x1558da;
    unlink("test_file");
    pcStack_3a8 = (code *)0x1558e6;
    unlink("test_file_link");
    pcStack_3a8 = (code *)0x1558eb;
    puVar7 = (uv_loop_t *)uv_default_loop();
    pcStack_3a8 = (code *)0x1558ff;
    uv_walk(puVar7,close_walk_cb,0);
    pcStack_3a8 = (code *)0x155909;
    uv_run(puVar7,0);
    pcStack_3a8 = (code *)0x15590e;
    puVar4 = (uv_loop_t *)uv_default_loop();
    pcStack_3a8 = (code *)0x155916;
    iVar1 = uv_loop_close();
    pcVar10 = acStack_3a0;
    if (iVar1 == 0) {
      return 0;
    }
  }
  pcStack_3a8 = chown_cb;
  run_test_fs_chown_cold_21();
  if (puVar4->backend_fd == 0x1a) {
    if (puVar4->watcher_queue[0] == (void *)0x0) {
      chown_cb_count = chown_cb_count + 1;
      iVar1 = uv_fs_req_cleanup();
      return iVar1;
    }
  }
  else {
    puStack_3b0 = (uv_loop_t *)0x1559af;
    chown_cb_cold_1();
  }
  puStack_3b0 = (uv_loop_t *)chown_root_cb;
  chown_cb_cold_2();
  puStack_3b0 = puVar7;
  if (puVar4->backend_fd == 0x1a) {
    pcStack_3b8 = (code *)0x1559c3;
    puVar9 = puVar4;
    _Var2 = geteuid();
    pvVar5 = puVar4->watcher_queue[0];
    if (_Var2 != 0) {
      if (pvVar5 == (void *)0xffffffffffffffff) goto LAB_001559db;
      pcStack_3b8 = (code *)0x1559d6;
      chown_root_cb_cold_2();
    }
    puVar7 = puVar4;
    if (pvVar5 == (void *)0x0) {
LAB_001559db:
      chown_cb_count = chown_cb_count + 1;
      iVar1 = uv_fs_req_cleanup(puVar4);
      return iVar1;
    }
  }
  else {
    pcStack_3b8 = (code *)0x1559ef;
    chown_root_cb_cold_1();
    puVar9 = puVar4;
  }
  pcStack_3b8 = fchown_cb;
  chown_root_cb_cold_3();
  if (puVar9->backend_fd == 0x1b) {
    if (puVar9->watcher_queue[0] == (void *)0x0) {
      fchown_cb_count = fchown_cb_count + 1;
      iVar1 = uv_fs_req_cleanup();
      return iVar1;
    }
  }
  else {
    pcStack_3c0 = (code *)0x155a13;
    fchown_cb_cold_1();
  }
  pcStack_3c0 = lchown_cb;
  fchown_cb_cold_2();
  if (puVar9->backend_fd == 0x1e) {
    if (puVar9->watcher_queue[0] == (void *)0x0) {
      lchown_cb_count = lchown_cb_count + 1;
      iVar1 = uv_fs_req_cleanup();
      return iVar1;
    }
  }
  else {
    pcStack_3c8 = (code *)0x155a37;
    lchown_cb_cold_1();
  }
  pcStack_3c8 = run_test_fs_link;
  lchown_cb_cold_2();
  pcVar8 = "test_file";
  pcStack_5a0 = (code *)0x155a55;
  puStack_3d0 = puVar7;
  pcStack_3c8 = (code *)pcVar10;
  unlink("test_file");
  pcStack_5a0 = (code *)0x155a61;
  unlink("test_file_link");
  pcStack_5a0 = (code *)0x155a6d;
  unlink("test_file_link2");
  pcStack_5a0 = (code *)0x155a72;
  loop = (uv_loop_t *)uv_default_loop();
  pcVar10 = (char *)0x0;
  pcStack_5a0 = (code *)0x155a96;
  iVar1 = uv_fs_open(0,acStack_588,"test_file",0x42,0x180,0);
  pcVar6 = pcStack_530;
  if (iVar1 < 0) {
    pcStack_5a0 = (code *)0x155dd4;
    run_test_fs_link_cold_1();
LAB_00155dd4:
    pcStack_5a0 = (code *)0x155dd9;
    run_test_fs_link_cold_2();
LAB_00155dd9:
    pcStack_5a0 = (code *)0x155dde;
    run_test_fs_link_cold_3();
LAB_00155dde:
    pcStack_5a0 = (code *)0x155de3;
    run_test_fs_link_cold_4();
LAB_00155de3:
    pcStack_5a0 = (code *)0x155de8;
    run_test_fs_link_cold_5();
LAB_00155de8:
    pcStack_5a0 = (code *)0x155ded;
    run_test_fs_link_cold_6();
LAB_00155ded:
    pcVar6 = pcVar8;
    pcStack_5a0 = (code *)0x155df2;
    run_test_fs_link_cold_7();
LAB_00155df2:
    pcStack_5a0 = (code *)0x155df7;
    run_test_fs_link_cold_8();
LAB_00155df7:
    pcStack_5a0 = (code *)0x155dfc;
    run_test_fs_link_cold_9();
LAB_00155dfc:
    pcStack_5a0 = (code *)0x155e01;
    run_test_fs_link_cold_10();
LAB_00155e01:
    pcStack_5a0 = (code *)0x155e06;
    run_test_fs_link_cold_11();
LAB_00155e06:
    pcStack_5a0 = (code *)0x155e0b;
    run_test_fs_link_cold_12();
LAB_00155e0b:
    pcStack_5a0 = (code *)0x155e10;
    run_test_fs_link_cold_13();
LAB_00155e10:
    pcVar8 = pcVar6;
    pcStack_5a0 = (code *)0x155e15;
    run_test_fs_link_cold_14();
LAB_00155e15:
    pcStack_5a0 = (code *)0x155e1a;
    run_test_fs_link_cold_15();
LAB_00155e1a:
    pcStack_5a0 = (code *)0x155e1f;
    run_test_fs_link_cold_16();
LAB_00155e1f:
    pcStack_5a0 = (code *)0x155e24;
    run_test_fs_link_cold_17();
LAB_00155e24:
    pcStack_5a0 = (code *)0x155e29;
    run_test_fs_link_cold_18();
  }
  else {
    pcVar8 = pcStack_530;
    if ((long)pcStack_530 < 0) goto LAB_00155dd4;
    pcStack_5a0 = (code *)0x155ab9;
    uv_fs_req_cleanup(acStack_588);
    pcStack_5a0 = (code *)0x155aca;
    uVar13 = (uv_buf_t)uv_buf_init(test_buf,0xd);
    uStack_598 = 0;
    pcVar10 = (char *)0x0;
    pcStack_5a0 = (code *)0x155b00;
    iov = uVar13;
    iVar1 = uv_fs_write(0,acStack_588,(ulong)pcVar6 & 0xffffffff,&iov,1,0xffffffffffffffff);
    pcVar8 = pcVar6;
    if (iVar1 != 0xd) goto LAB_00155dd9;
    if (pcStack_530 != (char *)0xd) goto LAB_00155dde;
    pcStack_5a0 = (code *)0x155b22;
    uv_fs_req_cleanup(acStack_588);
    pcStack_5a0 = (code *)0x155b35;
    uv_fs_close(loop,acStack_588,(ulong)pcVar6 & 0xffffffff,0);
    pcVar10 = (char *)0x0;
    pcStack_5a0 = (code *)0x155b50;
    iVar1 = uv_fs_link(0,acStack_588,"test_file","test_file_link",0);
    if (iVar1 != 0) goto LAB_00155de3;
    if (pcStack_530 != (char *)0x0) goto LAB_00155de8;
    pcStack_5a0 = (code *)0x155b71;
    uv_fs_req_cleanup();
    pcVar10 = (char *)0x0;
    pcStack_5a0 = (code *)0x155b8d;
    iVar1 = uv_fs_open(0,acStack_588,"test_file_link",2,0,0);
    pcVar6 = pcStack_530;
    pcVar8 = acStack_588;
    if (iVar1 < 0) goto LAB_00155ded;
    if ((long)pcStack_530 < 0) goto LAB_00155df2;
    pcStack_5a0 = (code *)0x155bb0;
    uv_fs_req_cleanup(acStack_588);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    pcStack_5a0 = (code *)0x155bd2;
    uVar13 = (uv_buf_t)uv_buf_init(buf,0x20);
    uStack_598 = 0;
    pcVar10 = (char *)0x0;
    pcStack_5a0 = (code *)0x155c04;
    iov = uVar13;
    iVar1 = uv_fs_read(0,acStack_588,(ulong)pcVar6 & 0xffffffff,&iov,1,0);
    if (iVar1 < 0) goto LAB_00155df7;
    if ((long)pcStack_530 < 0) goto LAB_00155dfc;
    pcVar10 = buf;
    pcStack_5a0 = (code *)0x155c2b;
    iVar1 = strcmp(buf,test_buf);
    if (iVar1 != 0) goto LAB_00155e01;
    pcStack_5a0 = (code *)0x155c3a;
    close((int)pcVar6);
    pcStack_5a0 = (code *)0x155c60;
    pcVar10 = (char *)loop;
    iVar1 = uv_fs_link(loop,acStack_588,"test_file","test_file_link2",link_cb);
    if (iVar1 != 0) goto LAB_00155e06;
    pcStack_5a0 = (code *)0x155c76;
    pcVar10 = (char *)loop;
    uv_run(loop,0);
    if (link_cb_count != 1) goto LAB_00155e0b;
    pcVar10 = (char *)0x0;
    pcStack_5a0 = (code *)0x155ca1;
    iVar1 = uv_fs_open(0,acStack_588,"test_file_link2",2,0,0);
    pcVar8 = pcStack_530;
    if (iVar1 < 0) goto LAB_00155e10;
    if ((long)pcStack_530 < 0) goto LAB_00155e15;
    pcStack_5a0 = (code *)0x155cc4;
    uv_fs_req_cleanup(acStack_588);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    pcStack_5a0 = (code *)0x155ce6;
    uVar13 = (uv_buf_t)uv_buf_init(buf,0x20);
    uStack_598 = 0;
    pcVar10 = (char *)0x0;
    pcStack_5a0 = (code *)0x155d18;
    iov = uVar13;
    iVar1 = uv_fs_read(0,acStack_588,(ulong)pcVar8 & 0xffffffff,&iov,1,0);
    if (iVar1 < 0) goto LAB_00155e1a;
    if ((long)pcStack_530 < 0) goto LAB_00155e1f;
    pcVar10 = buf;
    pcStack_5a0 = (code *)0x155d3f;
    iVar1 = strcmp(buf,test_buf);
    if (iVar1 != 0) goto LAB_00155e24;
    pcStack_5a0 = (code *)0x155d5c;
    uv_fs_close(loop,acStack_588,(ulong)pcVar8 & 0xffffffff,0);
    pcStack_5a0 = (code *)0x155d6a;
    uv_run(loop,0);
    pcStack_5a0 = (code *)0x155d76;
    unlink("test_file");
    pcStack_5a0 = (code *)0x155d82;
    unlink("test_file_link");
    pcStack_5a0 = (code *)0x155d8e;
    unlink("test_file_link2");
    pcStack_5a0 = (code *)0x155d93;
    pcVar8 = (char *)uv_default_loop();
    pcStack_5a0 = (code *)0x155da7;
    uv_walk(pcVar8,close_walk_cb,0);
    pcStack_5a0 = (code *)0x155db1;
    uv_run(pcVar8,0);
    pcStack_5a0 = (code *)0x155db6;
    pcVar10 = (char *)uv_default_loop();
    pcStack_5a0 = (code *)0x155dbe;
    iVar1 = uv_loop_close();
    if (iVar1 == 0) {
      return 0;
    }
  }
  pcStack_5a0 = link_cb;
  run_test_fs_link_cold_19();
  if (((uv_loop_t *)pcVar10)->backend_fd == 0x17) {
    if (((uv_loop_t *)pcVar10)->watcher_queue[0] == (void *)0x0) {
      link_cb_count = link_cb_count + 1;
      iVar1 = uv_fs_req_cleanup();
      return iVar1;
    }
  }
  else {
    pcStack_5a8 = (code *)0x155e4d;
    link_cb_cold_1();
  }
  pcStack_5a8 = run_test_fs_readlink;
  link_cb_cold_2();
  pcStack_5a8 = (code *)pcVar8;
  loop = (uv_loop_t *)uv_default_loop();
  iVar1 = uv_fs_readlink(loop,auStack_760,"no_such_file",dummy_cb);
  if (iVar1 == 0) {
    iVar1 = uv_run(loop,0);
    if (iVar1 != 0) goto LAB_00155f47;
    if (dummy_cb_count != 1) goto LAB_00155f4c;
    if (lStack_700 != 0) goto LAB_00155f51;
    if (lStack_708 != -2) goto LAB_00155f56;
    uv_fs_req_cleanup(auStack_760);
    iVar1 = uv_fs_readlink(0,auStack_760,"no_such_file",0);
    if (iVar1 != -2) goto LAB_00155f5b;
    if (lStack_700 != 0) goto LAB_00155f60;
    if (lStack_708 == -2) {
      uv_fs_req_cleanup(auStack_760);
      uVar3 = uv_default_loop();
      uv_walk(uVar3,close_walk_cb,0);
      uv_run(uVar3,0);
      uVar3 = uv_default_loop();
      iVar1 = uv_loop_close(uVar3);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_00155f6a;
    }
  }
  else {
    run_test_fs_readlink_cold_1();
LAB_00155f47:
    run_test_fs_readlink_cold_2();
LAB_00155f4c:
    run_test_fs_readlink_cold_3();
LAB_00155f51:
    run_test_fs_readlink_cold_4();
LAB_00155f56:
    run_test_fs_readlink_cold_5();
LAB_00155f5b:
    run_test_fs_readlink_cold_6();
LAB_00155f60:
    run_test_fs_readlink_cold_7();
  }
  run_test_fs_readlink_cold_8();
LAB_00155f6a:
  run_test_fs_readlink_cold_9();
  dummy_cb_count = dummy_cb_count + 1;
  return extraout_EAX;
}

Assistant:

TEST_IMPL(fs_unlink_readonly) {
  int r;
  uv_fs_t req;
  uv_file file;

  /* Setup. */
  unlink("test_file");

  loop = uv_default_loop();

  r = uv_fs_open(NULL,
                 &req,
                 "test_file",
                 O_RDWR | O_CREAT,
                 S_IWUSR | S_IRUSR,
                 NULL);
  ASSERT(r >= 0);
  ASSERT(req.result >= 0);
  file = req.result;
  uv_fs_req_cleanup(&req);

  iov = uv_buf_init(test_buf, sizeof(test_buf));
  r = uv_fs_write(NULL, &req, file, &iov, 1, -1, NULL);
  ASSERT(r == sizeof(test_buf));
  ASSERT(req.result == sizeof(test_buf));
  uv_fs_req_cleanup(&req);

  uv_fs_close(loop, &req, file, NULL);

  /* Make the file read-only */
  r = uv_fs_chmod(NULL, &req, "test_file", 0400, NULL);
  ASSERT(r == 0);
  ASSERT(req.result == 0);
  uv_fs_req_cleanup(&req);

  check_permission("test_file", 0400);

  /* Try to unlink the file */
  r = uv_fs_unlink(NULL, &req, "test_file", NULL);
  ASSERT(r == 0);
  ASSERT(req.result == 0);
  uv_fs_req_cleanup(&req);

  /*
  * Run the loop just to check we don't have make any extraneous uv_ref()
  * calls. This should drop out immediately.
  */
  uv_run(loop, UV_RUN_DEFAULT);

  /* Cleanup. */
  uv_fs_chmod(NULL, &req, "test_file", 0600, NULL);
  uv_fs_req_cleanup(&req);
  unlink("test_file");

  MAKE_VALGRIND_HAPPY();
  return 0;
}